

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall CVmObjDict::build_hash_from_image(CVmObjDict *this)

{
  CVmHashTable *p_00;
  size_t sVar1;
  CVmHashEntry ***pppCVar2;
  uint uVar3;
  uint uVar4;
  vm_dict_ext *pvVar5;
  unsigned_long uVar6;
  CVmHashEntryDict *this_00;
  CVmHashEntry *pCVar7;
  byte *__src;
  CVmObjDict *in_RDI;
  bool bVar8;
  size_t key_rem;
  char *keyp;
  char key_buf [256];
  CVmHashEntryDict *entry;
  char *key;
  uint item_cnt;
  uint key_len;
  vm_prop_id_t prop;
  vm_obj_id_t obj;
  vm_obj_id_t comp;
  char *endp;
  char *p;
  uint i;
  uint cnt;
  CVmHashEntry *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  undefined1 uVar9;
  CVmHashTable *this_01;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined2 in_stack_fffffffffffffea0;
  vm_prop_id_t in_stack_fffffffffffffea2;
  vm_obj_id_t in_stack_fffffffffffffea4;
  byte *local_150;
  byte local_148 [40];
  CVmObjDict *in_stack_fffffffffffffee0;
  int local_34;
  byte *local_18;
  uint local_10;
  
  pvVar5 = get_ext(in_RDI);
  p_00 = (CVmHashTable *)pvVar5->image_data_;
  this_01 = p_00;
  pvVar5 = get_ext(in_RDI);
  sVar1 = pvVar5->image_data_size_;
  pppCVar2 = &this_01->table_;
  uVar6 = ::osrp4(p_00);
  pvVar5 = get_ext(in_RDI);
  pvVar5->comparator_ = 0;
  set_comparator_type((CVmObjDict *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                      (vm_obj_id_t)((ulong)in_stack_fffffffffffffe78 >> 0x20));
  create_hash_table(in_stack_fffffffffffffee0);
  uVar3 = ::osrp2((char *)((long)&p_00->table_ + 4));
  local_18 = (byte *)((long)&p_00->table_ + 6);
  for (local_10 = 0; bVar8 = local_18 < (byte *)((long)pppCVar2 + sVar1),
      uVar9 = bVar8 && local_10 < uVar3, bVar8 && local_10 < uVar3; local_10 = local_10 + 1) {
    __src = local_18 + 1;
    uVar4 = (uint)*local_18;
    memcpy(local_148,__src,(ulong)uVar4);
    local_150 = local_148;
    for (this_00 = (CVmHashEntryDict *)(ulong)uVar4; this_00 != (CVmHashEntryDict *)0x0;
        this_00 = (CVmHashEntryDict *)((long)&this_00[-1].list_ + 7)) {
      *local_150 = *local_150 ^ 0xbd;
      local_150 = local_150 + 1;
    }
    local_34 = ::osrp2(__src + uVar4);
    local_18 = __src + uVar4 + 2;
    get_ext(in_RDI);
    pCVar7 = CVmHashTable::find(this_01,(char *)CONCAT17(uVar9,in_stack_fffffffffffffe80),
                                (size_t)in_stack_fffffffffffffe78);
    if (pCVar7 == (CVmHashEntry *)0x0) {
      in_stack_fffffffffffffe78 = (CVmHashEntry *)operator_new(0x30);
      CVmHashEntryDict::CVmHashEntryDict
                ((CVmHashEntryDict *)
                 CONCAT44(in_stack_fffffffffffffea4,
                          CONCAT22(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0)),
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (size_t)in_RDI,(int)((ulong)this_01 >> 0x20),(int)this_01);
      get_ext(in_RDI);
      CVmHashTable::add((CVmHashTable *)CONCAT17(uVar9,in_stack_fffffffffffffe80),
                        in_stack_fffffffffffffe78);
    }
    for (; local_34 != 0; local_34 = local_34 + -1) {
      ::osrp4(local_18);
      ::osrp2(local_18 + 4);
      CVmHashEntryDict::add_entry
                (this_00,in_stack_fffffffffffffea4,in_stack_fffffffffffffea2,
                 in_stack_fffffffffffffe9c);
      local_18 = local_18 + 6;
    }
  }
  pvVar5 = get_ext(in_RDI);
  pvVar5->comparator_ = (vm_obj_id_t)uVar6;
  return;
}

Assistant:

void CVmObjDict::build_hash_from_image(VMG0_)
{
    uint cnt;
    uint i;
    const char *p;
    const char *endp;
    vm_obj_id_t comp;

    /* start reading at the start of the image data */
    p = get_ext()->image_data_;
    endp = p + get_ext()->image_data_size_;

    /* read the comparator object ID */
    comp = (vm_obj_id_t)t3rp4u(p);
    p += 4;

    /*
     *   Do NOT install the actual comparator object at this point, but
     *   simply build the table tentatively with a nil comparator.  We can't
     *   assume that the comparator object has been loaded yet (as it might
     *   be loaded after us), so we cannot use it to build the hash table.
     *   We have to do something with the data, though, so build the hash
     *   table tentatively with no comparator; we'll rebuild it again at
     *   post-load-init time with the real comparator.
     *   
     *   (This isn't as inefficient as it sounds, as we retain all of the
     *   original hash table entries when we rebuild the table.  All we end
     *   up doing is scanning the entries again to recompute their new hash
     *   values, and reallocating the hash table object itself.)  
     */
    get_ext()->comparator_ = VM_INVALID_OBJ;
    set_comparator_type(vmg_ VM_INVALID_OBJ);

    /* create the new hash table */
    create_hash_table(vmg0_);

    /* read the entry count */
    cnt = osrp2(p);
    p += 2;

    /* scan the entries */
    for (i = 0 ; p < endp && i < cnt ; ++i)
    {
        vm_obj_id_t obj;
        vm_prop_id_t prop;
        uint key_len;
        uint item_cnt;
        const char *key;
        CVmHashEntryDict *entry;
        char key_buf[256];
        char *keyp;
        size_t key_rem;

        /* read the key length */
        key_len = *(unsigned char *)p++;

        /* remember the key pointer */
        key = p;
        p += key_len;

        /* copy the key to our buffer for decoding */
        memcpy(key_buf, key, key_len);

        /* decode the key */
        for (keyp = key_buf, key_rem = key_len ; key_rem != 0 ;
             --key_rem, ++keyp)
            *keyp ^= 0xBD;

        /* read the key from the decoded buffer now */
        key = key_buf;

        /* read the item count */
        item_cnt = osrp2(p);
        p += 2;

        /* find an existing entry for this key */
        entry = (CVmHashEntryDict *)get_ext()->hashtab_->find(key, key_len);

        /* if there's no existing entry, add one */
        if (entry == 0)
        {
            /* create a new entry */
            entry = new CVmHashEntryDict(key, key_len, TRUE, TRUE);

            /* add it to the table */
            get_ext()->hashtab_->add(entry);
        }

        /* read the items */
        for ( ; item_cnt != 0 ; --item_cnt)
        {
            /* read the object ID and property ID */
            obj = (vm_obj_id_t)t3rp4u(p);
            prop = (vm_prop_id_t)osrp2(p + 4);

            /* 
             *   add the entry - this entry is from the image file, so
             *   mark it as such 
             */
            entry->add_entry(obj, prop, TRUE);

            /* move on to the next item */
            p += 6;
        }
    }

    /* 
     *   Now that we're done building the table, remember the comparator.  We
     *   can't set the type yet, because the object might not be loaded yet -
     *   defer this until post-load initialization time.  
     */
    get_ext()->comparator_ = comp;
}